

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddColorDiagnosticsFlags(cmLocalGenerator *this,string *flags,string *lang)

{
  cmMakefile *this_00;
  bool bVar1;
  reference pbVar2;
  string *option;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  cmAlphaNum local_150;
  string local_120;
  cmAlphaNum local_100;
  cmAlphaNum local_d0;
  string local_a0;
  undefined1 local_80 [8];
  string colorFlagName;
  allocator<char> local_49;
  string local_48;
  cmValue local_28;
  cmValue diag;
  string *lang_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  this_00 = this->Makefile;
  diag.Value = lang;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_COLOR_DIAGNOSTICS",&local_49);
  local_28 = cmMakefile::GetDefinition(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  bVar1 = cmValue::IsSet(&local_28);
  if (bVar1) {
    std::__cxx11::string::string((string *)local_80);
    bVar1 = cmValue::IsOn(&local_28);
    if (bVar1) {
      cmAlphaNum::cmAlphaNum(&local_d0,"CMAKE_");
      cmAlphaNum::cmAlphaNum(&local_100,diag.Value);
      cmStrCat<char[35]>(&local_a0,&local_d0,&local_100,
                         (char (*) [35])"_COMPILE_OPTIONS_COLOR_DIAGNOSTICS");
      std::__cxx11::string::operator=((string *)local_80,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_150,"CMAKE_");
      cmAlphaNum::cmAlphaNum
                ((cmAlphaNum *)
                 &options.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,diag.Value);
      cmStrCat<char[39]>(&local_120,&local_150,
                         (cmAlphaNum *)
                         &options.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (char (*) [39])"_COMPILE_OPTIONS_COLOR_DIAGNOSTICS_OFF");
      std::__cxx11::string::operator=((string *)local_80,(string *)&local_120);
      std::__cxx11::string::~string((string *)&local_120);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2);
    cmMakefile::GetDefExpandList
              (this->Makefile,(string *)local_80,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2,false);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2);
    option = (string *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&option), bVar1) {
      pbVar2 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      (*this->_vptr_cmLocalGenerator[8])(this,flags,pbVar2);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
    std::__cxx11::string::~string((string *)local_80);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddColorDiagnosticsFlags(std::string& flags,
                                                const std::string& lang)
{
  cmValue diag = this->Makefile->GetDefinition("CMAKE_COLOR_DIAGNOSTICS");
  if (diag.IsSet()) {
    std::string colorFlagName;
    if (diag.IsOn()) {
      colorFlagName =
        cmStrCat("CMAKE_", lang, "_COMPILE_OPTIONS_COLOR_DIAGNOSTICS");
    } else {
      colorFlagName =
        cmStrCat("CMAKE_", lang, "_COMPILE_OPTIONS_COLOR_DIAGNOSTICS_OFF");
    }

    std::vector<std::string> options;
    this->Makefile->GetDefExpandList(colorFlagName, options);

    for (std::string const& option : options) {
      this->AppendFlagEscape(flags, option);
    }
  }
}